

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::MasteringMetadata::Valid(MasteringMetadata *this)

{
  bool bVar1;
  float *in_RDI;
  bool local_1;
  
  if (((in_RDI[1] == 3.4028235e+38) && (!NAN(in_RDI[1]))) ||
     ((0.0 < in_RDI[1] || in_RDI[1] == 0.0 &&
      ((in_RDI[1] <= 999.99 && (in_RDI[1] < *in_RDI || in_RDI[1] == *in_RDI)))))) {
    if (((*in_RDI == 3.4028235e+38) && (!NAN(*in_RDI))) ||
       ((0.0 < *in_RDI || *in_RDI == 0.0 && ((*in_RDI <= 9999.99 && (in_RDI[1] <= *in_RDI)))))) {
      if ((*(long *)(in_RDI + 2) == 0) ||
         (bVar1 = PrimaryChromaticity::Valid(*(PrimaryChromaticity **)(in_RDI + 2)), bVar1)) {
        if ((*(long *)(in_RDI + 4) == 0) ||
           (bVar1 = PrimaryChromaticity::Valid(*(PrimaryChromaticity **)(in_RDI + 4)), bVar1)) {
          if ((*(long *)(in_RDI + 6) == 0) ||
             (bVar1 = PrimaryChromaticity::Valid(*(PrimaryChromaticity **)(in_RDI + 6)), bVar1)) {
            if ((*(long *)(in_RDI + 8) == 0) ||
               (bVar1 = PrimaryChromaticity::Valid(*(PrimaryChromaticity **)(in_RDI + 8)), bVar1)) {
              local_1 = true;
            }
            else {
              local_1 = false;
            }
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool MasteringMetadata::Valid() const {
  if (luminance_min_ != kValueNotPresent) {
    if (luminance_min_ < kMinLuminance || luminance_min_ > kMinLuminanceMax ||
        luminance_min_ > luminance_max_) {
      return false;
    }
  }
  if (luminance_max_ != kValueNotPresent) {
    if (luminance_max_ < kMinLuminance || luminance_max_ > kMaxLuminanceMax ||
        luminance_max_ < luminance_min_) {
      return false;
    }
  }
  if (r_ && !r_->Valid())
    return false;
  if (g_ && !g_->Valid())
    return false;
  if (b_ && !b_->Valid())
    return false;
  if (white_point_ && !white_point_->Valid())
    return false;

  return true;
}